

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

StringPtr __thiscall
capnp::anon_unknown_1::CapnpcCppMain::protoName<capnp::schema::Method::Reader>
          (CapnpcCppMain *this,Reader proto)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint64_t in_RDX;
  bool bVar3;
  ArrayPtr<const_char> AVar4;
  NullableValue<capnp::schema::Value::Reader> local_48;
  
  annotationValue<capnp::schema::Method::Reader>
            ((Maybe<capnp::schema::Value::Reader> *)&local_48,(CapnpcCppMain *)0xf264a779fef191ce,
             proto,in_RDX);
  if (local_48.isSet == true) {
    bVar3 = local_48.field_1.value._reader.pointerCount == 0;
    if (bVar3) {
      local_48.field_1.value._reader.pointers = (WirePointer *)0x0;
    }
    local_48.field_1._16_4_ = 0x7fffffff;
    if (!bVar3) {
      local_48.field_1.value._reader.data._0_4_ = local_48.field_1.value._reader.nestingLimit;
    }
    local_48.isSet = false;
    local_48._1_3_ = 0;
    local_48._4_4_ = 0;
    uVar1 = 0;
    uVar2 = 0;
    proto._reader.pointers = local_48.field_1.value._reader.pointers;
    if (!bVar3) {
      local_48._0_4_ = local_48.field_1._0_4_;
      local_48._4_4_ = local_48.field_1._4_4_;
      uVar1 = local_48.field_1._8_4_;
      uVar2 = local_48.field_1._12_4_;
    }
  }
  else {
    bVar3 = proto._reader.pointerCount == 0;
    if (bVar3) {
      proto._reader.pointers = (WirePointer *)0x0;
    }
    local_48.field_1._16_4_ = 0x7fffffff;
    if (!bVar3) {
      local_48.field_1._16_4_ = proto._reader.nestingLimit;
    }
    local_48.isSet = false;
    local_48._1_3_ = 0;
    local_48._4_4_ = 0;
    uVar1 = 0;
    uVar2 = 0;
    if (!bVar3) {
      local_48._0_4_ = proto._reader.segment._0_4_;
      local_48._4_4_ = proto._reader.segment._4_4_;
      uVar1 = proto._reader.capTable._0_4_;
      uVar2 = proto._reader.capTable._4_4_;
    }
  }
  local_48.field_1.value._reader.capTable = (CapTableReader *)proto._reader.pointers;
  local_48.field_1._4_4_ = uVar2;
  local_48.field_1._0_4_ = uVar1;
  AVar4 = (ArrayPtr<const_char>)
          _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_48,(void *)0x0,0);
  return (StringPtr)AVar4;
}

Assistant:

kj::StringPtr protoName(P proto) {
    KJ_IF_SOME(name, annotationValue(proto, NAME_ANNOTATION_ID)) {
      return name.getText();
    } else {
      return proto.getName();
    }
  }